

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

void nk_plot(nk_context *ctx,nk_chart_type type,float *values,int count,int offset)

{
  float *pfVar1;
  int iVar2;
  ulong uVar3;
  float min_value;
  float max_value;
  float fVar4;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Tigermouthbear[P]flappytiger/external/glfw/deps/nuklear.h"
                  ,0x5e04,
                  "void nk_plot(struct nk_context *, enum nk_chart_type, const float *, int, int)");
  }
  if (values == (float *)0x0) {
    __assert_fail("values",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Tigermouthbear[P]flappytiger/external/glfw/deps/nuklear.h"
                  ,0x5e05,
                  "void nk_plot(struct nk_context *, enum nk_chart_type, const float *, int, int)");
  }
  if (count != 0) {
    pfVar1 = values + offset;
    min_value = *pfVar1;
    max_value = min_value;
    if (0 < count) {
      uVar3 = 0;
      fVar4 = min_value;
      do {
        min_value = pfVar1[uVar3];
        if (max_value <= min_value) {
          max_value = min_value;
        }
        if (fVar4 <= min_value) {
          min_value = fVar4;
        }
        uVar3 = uVar3 + 1;
        fVar4 = min_value;
      } while ((uint)count != uVar3);
    }
    iVar2 = nk_chart_begin_colored
                      (ctx,type,(ctx->style).chart.color,(ctx->style).chart.selected_color,count,
                       min_value,max_value);
    if (iVar2 != 0) {
      if (0 < count) {
        uVar3 = 0;
        do {
          nk_chart_push_slot(ctx,pfVar1[uVar3],0);
          uVar3 = uVar3 + 1;
        } while ((uint)count != uVar3);
      }
      nk_chart_end(ctx);
      return;
    }
  }
  return;
}

Assistant:

NK_API void
nk_plot(struct nk_context *ctx, enum nk_chart_type type, const float *values,
    int count, int offset)
{
    int i = 0;
    float min_value;
    float max_value;

    NK_ASSERT(ctx);
    NK_ASSERT(values);
    if (!ctx || !values || !count) return;

    min_value = values[offset];
    max_value = values[offset];
    for (i = 0; i < count; ++i) {
        min_value = NK_MIN(values[i + offset], min_value);
        max_value = NK_MAX(values[i + offset], max_value);
    }

    if (nk_chart_begin(ctx, type, count, min_value, max_value)) {
        for (i = 0; i < count; ++i)
            nk_chart_push(ctx, values[i + offset]);
        nk_chart_end(ctx);
    }
}